

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O3

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcOrientation
          (DeadReckoningCalculator *this,EulerAngles *OrientationOut,KFLOAT32 totalTimeSinceReset)

{
  float fVar1;
  float *pfVar2;
  KFLOAT32 *pKVar3;
  long lVar4;
  float (*pafVar5) [3];
  KUINT16 i;
  long lVar6;
  long lVar7;
  TMATRIX *pTVar8;
  KUINT16 j;
  TMATRIX *pTVar9;
  KUINT16 k;
  float fVar10;
  undefined1 auVar11 [16];
  bool bVar13;
  undefined4 uVar14;
  TMATRIX DR;
  TMATRIX local_34;
  long lVar12;
  
  pfVar2 = local_34.Data[0] + 1;
  lVar4 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    auVar11 = _DAT_002b9800;
    do {
      bVar13 = SUB164(auVar11 ^ _DAT_002b97e0,4) == -0x80000000 &&
               SUB164(auVar11 ^ _DAT_002b97e0,0) < -0x7ffffffd;
      if (bVar13) {
        uVar14 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar14 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7 + -4) = uVar14;
      }
      if (bVar13) {
        uVar14 = 0x3f800000;
        if (lVar4 + -4 != lVar7) {
          uVar14 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar14;
      }
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x10);
    lVar6 = lVar6 + 1;
    lVar4 = lVar4 + 4;
    pfVar2 = pfVar2 + 3;
  } while (lVar6 != 3);
  if (this->m_bQuaxAxisSet == true) {
    computeDRMatrix_asQuat(this,&local_34,totalTimeSinceReset);
  }
  else {
    computeDRMatrix(this,&local_34,totalTimeSinceReset);
  }
  pafVar5 = (float (*) [3])&local_34;
  lVar4 = 0;
  do {
    lVar6 = 0;
    pTVar8 = &this->m_initOrientationMatrix;
    do {
      fVar10 = 0.0;
      lVar7 = 0;
      pTVar9 = pTVar8;
      do {
        fVar10 = fVar10 + (*(float (*) [3])*pafVar5)[lVar7] * pTVar9->Data[0][0];
        lVar7 = lVar7 + 1;
        pTVar9 = (TMATRIX *)(pTVar9->Data + 1);
      } while (lVar7 != 3);
      local_34.Data[lVar4][lVar6] = fVar10;
      lVar6 = lVar6 + 1;
      pTVar8 = (TMATRIX *)(pTVar8->Data[0] + 1);
    } while (lVar6 != 3);
    lVar4 = lVar4 + 1;
    pafVar5 = pafVar5 + 1;
  } while (lVar4 != 3);
  matrixToHPR_new(&local_34,OrientationOut);
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
  fVar10 = (float)*pKVar3;
  if (-3.1415927 <= fVar10) {
    if (3.1415927 < fVar10) {
      fVar10 = fVar10 + -6.2831855;
    }
  }
  else {
    fVar10 = fVar10 + 6.2831855;
  }
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
  *pKVar3 = (KFLOAT32)fVar10;
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
  fVar10 = (float)*pKVar3;
  if (-1.5707964 <= fVar10) {
    if (fVar10 <= 1.5707964) goto LAB_002a0278;
    fVar1 = 3.1415927;
  }
  else {
    fVar1 = -3.1415927;
  }
  fVar10 = fVar1 - fVar10;
LAB_002a0278:
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
  *pKVar3 = (KFLOAT32)fVar10;
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,2);
  fVar10 = (float)*pKVar3;
  if (-3.1415927 <= fVar10) {
    if (3.1415927 < fVar10) {
      fVar10 = fVar10 + -6.2831855;
    }
  }
  else {
    fVar10 = fVar10 + 6.2831855;
  }
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,2);
  *pKVar3 = (KFLOAT32)fVar10;
  computeRotationAxis(this,&local_34);
  return;
}

Assistant:

void DeadReckoningCalculator::calcOrientation( EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset  )
{
    // compute the DR matrix
    TMATRIX DR;
    if (m_bQuaxAxisSet)
        computeDRMatrix_asQuat( DR, totalTimeSinceReset );
    else
        computeDRMatrix( DR, totalTimeSinceReset );

    TMATRIX curOrientationMatrix = DR * m_initOrientationMatrix;
    //TMATRIX curOrientationMatrix = m_initOrientationMatrix;

    matrixToHPR_new( curOrientationMatrix, OrientationOut );
    //matrixToHPR( curOrientationMatrix, m_curOrientation );
    OrientationOut[0] = checkAngleHR( OrientationOut[0]);
    OrientationOut[1] = checkAngleP(OrientationOut[1]);
    OrientationOut[2] = checkAngleHR( OrientationOut[2]);

    computeRotationAxis(curOrientationMatrix);
}